

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

void __thiscall
peach::exception::PositionalError::PositionalError
          (PositionalError *this,size_t line,size_t position,string *exceptionClass,string *comment)

{
  size_type *psVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_t sVar9;
  char cVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  string local_b8;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48;
  long lStack_40;
  string *local_38;
  
  pcVar3 = (comment->_M_dataplus)._M_p;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + comment->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  cVar10 = '\x01';
  if (9 < line) {
    sVar9 = line;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (sVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00124587;
      }
      if (sVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00124587;
      }
      if (sVar9 < 10000) goto LAB_00124587;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar4);
    cVar10 = cVar10 + '\x01';
  }
LAB_00124587:
  local_78 = local_68;
  local_38 = exceptionClass;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,line);
  uVar2 = CONCAT44(uStack_6c,local_70) + local_f0;
  uVar11 = 0xf;
  if (local_f8 != local_e8) {
    uVar11 = local_e8[0];
  }
  if (uVar11 < uVar2) {
    uVar11 = 0xf;
    if (local_78 != local_68) {
      uVar11 = local_68[0];
    }
    if (uVar11 < uVar2) goto LAB_0012460b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_0012460b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_78);
  }
  local_d8 = &local_c8;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_c8 = *plVar7;
    uStack_c0 = puVar6[3];
  }
  else {
    local_c8 = *plVar7;
    local_d8 = (long *)*puVar6;
  }
  local_d0 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_48 = *puVar8;
    lStack_40 = plVar7[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *puVar8;
    local_58 = (ulong *)*plVar7;
  }
  local_50 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar10 = '\x01';
  if (9 < position) {
    sVar9 = position;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (sVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0012472c;
      }
      if (sVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0012472c;
      }
      if (sVar9 < 10000) goto LAB_0012472c;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar4);
    cVar10 = cVar10 + '\x01';
  }
LAB_0012472c:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,position);
  uVar2 = CONCAT44(uStack_8c,local_90) + local_50;
  uVar11 = 0xf;
  if (local_58 != &local_48) {
    uVar11 = local_48;
  }
  if (uVar11 < uVar2) {
    uVar11 = 0xf;
    if (local_98 != local_88) {
      uVar11 = local_88[0];
    }
    if (uVar2 <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_58);
      goto LAB_001247ba;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98);
LAB_001247ba:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  PeachException::PeachException(&this->super_PeachException,local_38,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  *(undefined ***)&this->super_PeachException = &PTR__PeachException_00131628;
  this->line_ = line;
  this->position_ = position;
  return;
}

Assistant:

PositionalError(std::size_t line,
                    std::size_t position,
                    const std::string &exceptionClass,
                    const std::string &comment)
        : PeachException(exceptionClass,
                         comment + " at " +
                             std::to_string(line) +
                             ":" + std::to_string(position)),
          line_(line),
          position_(position)
    {
    }